

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_tree_renderer.cpp
# Opt level: O1

void __thiscall
duckdb::JSONTreeRenderer::ToStreamInternal(JSONTreeRenderer *this,RenderTree *root,ostream *ss)

{
  yyjson_val_pool *pool;
  ulong uVar1;
  yyjson_mut_doc *doc;
  yyjson_mut_val *pyVar2;
  char *__s;
  size_t sVar3;
  InternalException *this_00;
  yyjson_mut_val *pyVar4;
  yyjson_mut_val *val;
  bool bVar5;
  string local_50;
  
  val = (yyjson_mut_val *)0x0;
  doc = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
  if (doc == (yyjson_mut_doc *)0x0) goto LAB_001e5634;
  pool = &doc->val_pool;
  if ((doc->val_pool).end == (doc->val_pool).cur) {
    bVar5 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pool,&doc->alc,1);
    if (bVar5) goto LAB_001e5618;
    val = (yyjson_mut_val *)0x0;
  }
  else {
LAB_001e5618:
    val = pool->cur;
    pool->cur = val + 1;
  }
  if (val == (yyjson_mut_val *)0x0) {
    val = (yyjson_mut_val *)0x0;
  }
  else {
    val->tag = 6;
  }
LAB_001e5634:
  if (doc != (yyjson_mut_doc *)0x0) {
    doc->root = val;
  }
  bVar5 = false;
  pyVar2 = RenderRecursive(doc,root,0,0);
  if (val != (yyjson_mut_val *)0x0) {
    bVar5 = (val->tag & 7) == 6;
  }
  if ((pyVar2 != (yyjson_mut_val *)0x0) && (bVar5)) {
    uVar1 = val->tag;
    val->tag = uVar1 + 0x100;
    pyVar4 = pyVar2;
    if (0xff < uVar1) {
      pyVar4 = *(yyjson_mut_val **)((val->uni).u64 + 0x10);
      *(yyjson_mut_val **)((val->uni).u64 + 0x10) = pyVar2;
    }
    pyVar2->next = pyVar4;
    (val->uni).str = (char *)pyVar2;
  }
  __s = duckdb_yyjson::yyjson_mut_val_write_opts
                  (val,9,(yyjson_alc *)0x0,(usize *)0x0,(yyjson_write_err *)0x0);
  if (__s != (char *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar3 = strlen(__s);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar3);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (ss,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    free(__s);
    duckdb_yyjson::yyjson_mut_doc_free(doc);
    return;
  }
  duckdb_yyjson::yyjson_mut_doc_free(doc);
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"The plan could not be rendered as JSON, yyjson failed","");
  InternalException::InternalException(this_00,&local_50);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void JSONTreeRenderer::ToStreamInternal(RenderTree &root, std::ostream &ss) {
	auto doc = yyjson_mut_doc_new(nullptr);
	auto result_obj = yyjson_mut_arr(doc);
	yyjson_mut_doc_set_root(doc, result_obj);

	auto plan = RenderRecursive(doc, root, 0, 0);
	yyjson_mut_arr_append(result_obj, plan);

	auto data = yyjson_mut_val_write_opts(result_obj, YYJSON_WRITE_ALLOW_INF_AND_NAN | YYJSON_WRITE_PRETTY, nullptr,
	                                      nullptr, nullptr);
	if (!data) {
		yyjson_mut_doc_free(doc);
		throw InternalException("The plan could not be rendered as JSON, yyjson failed");
	}
	ss << string(data);
	free(data);
	yyjson_mut_doc_free(doc);
}